

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpResponse.cpp
# Opt level: O2

void __thiscall xmrig::HttpResponse::end(HttpResponse *this,char *data,size_t size)

{
  pointer pcVar1;
  size_t sVar2;
  size_t sVar3;
  bool bVar4;
  ostream *poVar5;
  char *pcVar6;
  _Base_ptr p_Var7;
  HttpContext *ctx;
  WriteBaton *this_00;
  size_type sVar8;
  mapped_type *pmVar9;
  pointer pcVar10;
  map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_01;
  allocator local_232;
  allocator local_231;
  char *local_230;
  char *local_228;
  string local_220;
  ulong local_200;
  key_type local_1f8;
  key_type local_1d8;
  stringstream ss;
  ostream local_1a8 [376];
  
  bVar4 = isAlive(this);
  if (bVar4) {
    if (size == 0 && data != (char *)0x0) {
      size = strlen(data);
    }
    if ((char *)size != (char *)0x0) {
      std::__cxx11::string::string((string *)&ss,"Content-Length",(allocator *)&local_1f8);
      std::__cxx11::to_string(&local_220,size);
      setHeader(this,(string *)&ss,&local_220);
      std::__cxx11::string::~string((string *)&local_220);
      std::__cxx11::string::~string((string *)&ss);
    }
    std::__cxx11::string::string((string *)&ss,"Connection",(allocator *)&local_1f8);
    std::__cxx11::string::string((string *)&local_220,"close",(allocator *)&local_1d8);
    local_230 = (char *)size;
    local_228 = data;
    setHeader(this,(string *)&ss,&local_220);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::~string((string *)&ss);
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar5 = std::operator<<(local_1a8,"HTTP/1.1 ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,this->m_statusCode);
    poVar5 = std::operator<<(poVar5," ");
    pcVar6 = http_status_str(this->m_statusCode);
    poVar5 = std::operator<<(poVar5,pcVar6);
    std::operator<<(poVar5,"\r\n");
    for (p_Var7 = (this->m_headers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var7 != &(this->m_headers)._M_t._M_impl.super__Rb_tree_header;
        p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
      poVar5 = std::operator<<(local_1a8,(string *)(p_Var7 + 1));
      poVar5 = std::operator<<(poVar5,": ");
      poVar5 = std::operator<<(poVar5,(string *)(p_Var7 + 2));
      std::operator<<(poVar5,"\r\n");
    }
    std::operator<<(local_1a8,"\r\n");
    ctx = HttpContext::get(0x161086);
    this_00 = (WriteBaton *)operator_new(0x108);
    WriteBaton::WriteBaton(this_00,&ss,local_228,(size_t)local_230,ctx);
    if (399 < this->m_statusCode) {
      HttpContext::ip_abi_cxx11_(&local_220,ctx);
      local_228 = local_220._M_dataplus._M_p;
      local_230 = http_method_str((ctx->super_HttpData).method);
      pcVar1 = (ctx->super_HttpData).url._M_dataplus._M_p;
      local_200 = (ulong)(uint)this->m_statusCode;
      sVar2 = this_00->bufs[1].len;
      sVar3 = this_00->bufs[0].len;
      std::__cxx11::string::string((string *)&local_1f8,"user-agent",&local_231);
      this_01 = &(ctx->super_HttpData).headers;
      sVar8 = std::
              map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::count(this_01,&local_1f8);
      if (sVar8 == 0) {
        pcVar10 = (pointer)0x0;
      }
      else {
        std::__cxx11::string::string((string *)&local_1d8,"user-agent",&local_232);
        pmVar9 = std::
                 map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::at(this_01,&local_1d8);
        pcVar10 = (pmVar9->_M_dataplus)._M_p;
      }
      Log::print(ERR,
                 "\x1b[0;36m%s \x1b[0m\x1b[0m\x1b[1;35m%s\x1b[0m\x1b[1;37m %s \x1b[0m\x1b[1;%dm%d \x1b[0m\x1b[1;37m%zu \x1b[0m\x1b[1;30m\"%s\"\x1b[0m"
                 ,local_228,local_230,pcVar1,0x1f,local_200,sVar2 + sVar3,pcVar10);
      if (sVar8 != 0) {
        std::__cxx11::string::~string((string *)&local_1d8);
      }
      std::__cxx11::string::~string((string *)&local_1f8);
      std::__cxx11::string::~string((string *)&local_220);
    }
    uv_write(this_00,ctx->m_tcp,this_00->bufs,2 - (uint)(this_00->bufs[1].base == (char *)0x0),
             WriteBaton::onWrite);
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  }
  return;
}

Assistant:

void xmrig::HttpResponse::end(const char *data, size_t size)
{
    if (!isAlive()) {
        return;
    }

    if (data && !size) {
        size = strlen(data);
    }

    if (size) {
        setHeader("Content-Length", std::to_string(size));
    }

    setHeader("Connection", "close");

    std::stringstream ss;
    ss << "HTTP/1.1 " << statusCode() << " " << http_status_str(static_cast<http_status>(statusCode())) << kCRLF;

    for (auto &header : m_headers) {
        ss << header.first << ": " << header.second << kCRLF;
    }

    ss << kCRLF;

    HttpContext *ctx  = HttpContext::get(m_id);
    WriteBaton *baton = new WriteBaton(ss, data, size, ctx);

#   ifndef APP_DEBUG
    if (statusCode() >= 400)
#   endif
    {
        const bool err = statusCode() >= 400;

        Log::print(err ? Log::ERR : Log::INFO, CYAN("%s ") CLEAR MAGENTA_BOLD("%s") WHITE_BOLD(" %s ") CSI "1;%dm%d " CLEAR WHITE_BOLD("%zu ") BLACK_BOLD("\"%s\""),
                   ctx->ip().c_str(),
                   http_method_str(static_cast<http_method>(ctx->method)),
                   ctx->url.c_str(),
                   err ? 31 : 32,
                   statusCode(),
                   baton->size(),
                   ctx->headers.count(kUserAgent) ? ctx->headers.at(kUserAgent).c_str() : nullptr
                   );
    }

    uv_write(&baton->req, ctx->stream(), baton->bufs, baton->count(), WriteBaton::onWrite);
}